

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::EmptyQueueExpressionSyntax::getChild(EmptyQueueExpressionSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  
  if (in_RDX == 0) {
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
  }
  else if (in_RDX == 1) {
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
  }
  else {
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
  }
  return in_RDI;
}

Assistant:

TokenOrSyntax EmptyQueueExpressionSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return openBrace;
        case 1: return closeBrace;
        default: return nullptr;
    }
}